

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

AssertionResult
testing::internal::CmpHelperEQ<testing::StrictMock<mock_allocator<char>>*,mock_allocator<char>*>
          (char *expected_expression,char *actual_expression,
          StrictMock<mock_allocator<char>_> **expected,mock_allocator<char> **actual)

{
  long *in_RCX;
  StrictMock<mock_allocator<char>_> **in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  StrictMock<mock_allocator<char>_> **in_RDI;
  string *in_R8;
  AssertionResult AVar2;
  StrictMock<mock_allocator<char>_> **value;
  long local_80;
  string local_68 [32];
  string local_48 [23];
  undefined1 in_stack_ffffffffffffffcf;
  string *in_stack_ffffffffffffffd0;
  StrictMock<mock_allocator<char>_> **expected_expression_00;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar1
  ;
  
  local_80 = 0;
  if (*in_RCX != 0) {
    local_80 = *in_RCX + 8;
  }
  if (local_80 == *(long *)in_R8) {
    AVar2 = AssertionSuccess();
    sVar1 = AVar2.message_.ptr_;
  }
  else {
    value = in_RDI;
    expected_expression_00 = in_RDX;
    FormatForComparisonFailureMessage<testing::StrictMock<mock_allocator<char>>*,mock_allocator<char>*>
              (in_RDI,(mock_allocator<char> **)in_RDX);
    FormatForComparisonFailureMessage<mock_allocator<char>*,testing::StrictMock<mock_allocator<char>>*>
              ((mock_allocator<char> **)value,in_RDX);
    EqFailure((char *)expected_expression_00,(char *)in_RCX,in_R8,in_stack_ffffffffffffffd0,
              (bool)in_stack_ffffffffffffffcf);
    std::__cxx11::string::~string(local_68);
    std::__cxx11::string::~string(local_48);
    sVar1.ptr_ = extraout_RDX;
  }
  AVar2.message_.ptr_ = sVar1.ptr_;
  AVar2._0_8_ = in_RDI;
  return AVar2;
}

Assistant:

AssertionResult CmpHelperEQ(const char* expected_expression,
                            const char* actual_expression,
                            const T1& expected,
                            const T2& actual) {
#ifdef _MSC_VER
# pragma warning(push)          // Saves the current warning state.
# pragma warning(disable:4389)  // Temporarily disables warning on
                                // signed/unsigned mismatch.
#endif

  if (expected == actual) {
    return AssertionSuccess();
  }

#ifdef _MSC_VER
# pragma warning(pop)          // Restores the warning state.
#endif

  return EqFailure(expected_expression,
                   actual_expression,
                   FormatForComparisonFailureMessage(expected, actual),
                   FormatForComparisonFailureMessage(actual, expected),
                   false);
}